

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillCMakeEnvironmentPath(cmFindBase *this)

{
  bool bVar1;
  mapped_type *this_00;
  string var;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeEnvironment);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_",(allocator<char> *)&local_60);
  std::__cxx11::string::append((string *)&local_40);
  std::__cxx11::string::append((char *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PREFIX_PATH",&local_61);
  cmSearchPath::AddEnvPrefixPath(this_00,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  cmSearchPath::AddEnvPath(this_00,&local_40);
  bVar1 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CMAKE_APPBUNDLE_PATH",&local_61);
    cmSearchPath::AddEnvPath(this_00,&local_60);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"CMAKE_FRAMEWORK_PATH",&local_61);
    cmSearchPath::AddEnvPath(this_00,&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmFindBase::FillCMakeEnvironmentPath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];

  // Add CMAKE_*_PATH environment variables
  std::string var = "CMAKE_";
  var += this->CMakePathName;
  var += "_PATH";
  paths.AddEnvPrefixPath("CMAKE_PREFIX_PATH");
  paths.AddEnvPath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}